

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_encoding.h
# Opt level: O0

bool draco::EncodeVarint<unsigned_int>(uint val,EncoderBuffer *out_buffer)

{
  byte bVar1;
  bool bVar2;
  uint in_ESI;
  uint in_EDI;
  uint8_t out;
  undefined4 in_stack_00000014;
  EncoderBuffer *in_stack_00000018;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 local_1;
  
  if (in_EDI < 0x80) {
    bVar2 = EncoderBuffer::Encode<unsigned_char>
                      (in_stack_00000018,(uchar *)CONCAT44(in_stack_00000014,val));
    if (bVar2) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    bVar1 = (byte)in_EDI & 0x7f | 0x80;
    bVar2 = EncoderBuffer::Encode<unsigned_char>
                      (in_stack_00000018,(uchar *)CONCAT44(in_stack_00000014,val));
    if (bVar2) {
      bVar2 = EncodeVarint<unsigned_int>
                        (in_ESI,(EncoderBuffer *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
      if (bVar2) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool EncodeVarint(IntTypeT val, EncoderBuffer *out_buffer) {
  if (std::is_unsigned<IntTypeT>::value) {
    // Coding of unsigned values.
    // 0-6 bit - data
    // 7 bit - next byte?
    uint8_t out = 0;
    out |= val & ((1 << 7) - 1);
    if (val >= (1 << 7)) {
      out |= (1 << 7);
      if (!out_buffer->Encode(out)) {
        return false;
      }
      if (!EncodeVarint<IntTypeT>(val >> 7, out_buffer)) {
        return false;
      }
      return true;
    }
    if (!out_buffer->Encode(out)) {
      return false;
    }
  } else {
    // IntTypeT is a signed value. Convert to unsigned symbol and encode.
    const typename std::make_unsigned<IntTypeT>::type symbol =
        ConvertSignedIntToSymbol(val);
    if (!EncodeVarint(symbol, out_buffer)) {
      return false;
    }
  }
  return true;
}